

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sprites.c
# Opt level: O0

void jiangwei(dw_rom *rom)

{
  dw_rom *rom_local;
  
  doae(rom);
  vpatch(rom,0x1a8e,3,0x29,0x37,0x14);
  set_player_palette(rom,'\x01');
  vpatch(rom,0x12260,0x40,0x80,0xf0,0xf8,0xe8,0xc0,0xf0,0x50,0x50,0,0xf0,0xf8,0xf8,0xf8,0xf8,0xf8,
         0xf8,0xc0,0xc0,0xe0,200,200,0xf8,0xf0,0,0x78,0x78,0xb0,0xf8,0xf0,0x38,0xc0,0xe0,0x80,0xf0,
         0xf8,0xe8,0xc0,0xf0,0x50,0x50,0,0xf0,0xf8,0xf8,0xf8,0xf8,0xf8,0xf8,0xc0,0xc0,0xec,0xfc,0xfc
         ,0xf8,0xf0,0,0x78,0x78,0xbe,0xde,0xe4,0x38,0xc0,0x38);
  vpatch(rom,0x12300,0x80,1,3,7,5,8,0xe,10,0x1a,0,3,7,7,0xf,0xf,0xf,0x1f,0x38,0x3c,0x3e,0x1f,0x1f,
         0xf,3,1,0x3f,0x3f,0x3f,0x3f,0x19,0xe,0x1f,0xf,1,0x17,0x2f,0x35,0x18,0x1e,10,0x1a,0,3,7,7,
         0xf,0xf,0xf,0x1f,0x38,0x1c,0x1e,0x3f,0x1f,0xf,0xf,3,0x3f,0x7f,0x7f,0x3f,0x1b,0xc,0xf,0xf,
         0x80,0xc0);
  vpatch(rom,0x12400,0x180,1,3,7,5,8,0xe,10,0x1a,0,3,7,7,0xf,0xf,0xf,0x1f,0x38,0x3c,0x3e,0x1f,0x1f,
         0xf,3,1,0x3f,0x3f,0x3f,0x3f,0x19,0xe,0x1f,0xf,0x80,0xe8,0xf4,0xac,0x18,0x78,0x50,0x58,0,
         0xc0,0xe0,0xe0,0xf0,0xf0,0xf0,0xf8,0x1c,0x38,0x78,0xfc,0xf8,0xf8,0xf0,0xc0,0xfc,0xfe,0xfe,
         0xfc,0xd8,0x38,0xf0,0xf0,1,0x17);
  vpatch(rom,0x12a20,0x70,0x3f,0x7f,0x7f,0x3f,0x1f,0xf,0xf,0,0x30,0x7f,0x7f,0x7f,0x7c,0x33,0xf,0xf,
         0xff,0xff,0xfe,0xfc,0xf8,0xf0,0xc0,0x80,0xf,0xff,0xfe,0xfc,0x18,0xe0,0xf0,0x80,1,3,7,7,0xf,
         0xf,0x1f,0x3f,0,2,7,6,0xe,0xe,0x1e,0x3f,0x80,0xc6,0xef,0xe3,0xf3,0xf9,0xff,0xff,0,0x46,0x6f
         ,0xaf,0xbf,0xb7,0xd9,0xdd,0x7f,0x7f);
  vpatch(rom,0x12aa0,0x10,0xf8,0xf8,0xfd,0xff,0xff,0x7f,0x7e,0,0xf,0xef,0xf7,0xfb,0xfc,7,0xf8,199);
  vpatch(rom,0x12ac0,0x10,0x80,0xc6,0xef,0xe3,0xf3,0xf9,0xff,0xff,0,0x46,0x6f,0xef,0xff,0xf7,0x79,
         0x7d);
  vpatch(rom,0x12ae0,0x10,0xf8,0xf8,0xfd,0xfe,0xfe,0x7f,0x7e,0,0xf,0xef,0xf7,0xfb,0xff,7,0x78,0x3c);
  vpatch(rom,0x12b50,0x10,0x30,0xf8,0xfc,0xb4,2,0xce,0x4a,0x4b,0,0x78,0xfc,0xfc,0xfe,0xfe,0xfe,0xff)
  ;
  vpatch(rom,0x12b80,0x20,0x30,0x7d,0xfe,0xb4,2,0xce,0x4a,0x4b,0,0x78,0xfc,0xfc,0xfe,0xfe,0xfe,0xff,
         0x30,0xfe,0xff,0xfd,0xf8,0xfe,0xea,0xea,0,0x3e,0x7f,0xff,0xff,0xff,0xff,0xff);
  vpatch(rom,0x12bd0,0x10,0xb0,0x7e,0xff,0xfd,0xf8,0xfe,0xea,0xea,0,0x3e,0x7f,0xff,0xff,0xff,0xff,
         0xff);
  return;
}

Assistant:

static void jiangwei(dw_rom *rom)
{
    doae(rom);
    vpatch(rom, 0x01a8e,   3, 0x29, 0x37, 0x14);
    set_player_palette(rom, 1);
    vpatch(rom, 0x12260,  64, 0x80, 0xF0, 0xF8, 0xE8, 0xC0, 0xF0, 0x50, 0x50, 0x00, 0xF0, 0xF8, 0xF8, 0xF8, 0xF8, 0xF8, 0xF8, 0xC0, 0xC0, 0xE0, 0xC8, 0xC8, 0xF8, 0xF0, 0x00, 0x78, 0x78, 0xB0, 0xF8, 0xF0, 0x38, 0xC0, 0xE0, 0x80, 0xF0, 0xF8, 0xE8, 0xC0, 0xF0, 0x50, 0x50, 0x00, 0xF0, 0xF8, 0xF8, 0xF8, 0xF8, 0xF8, 0xF8, 0xC0, 0xC0, 0xEC, 0xFC, 0xFC, 0xF8, 0xF0, 0x00, 0x78, 0x78, 0xBE, 0xDE, 0xE4, 0x38, 0xC0, 0x38);
    vpatch(rom, 0x12300, 128, 0x01, 0x03, 0x07, 0x05, 0x08, 0x0E, 0x0A, 0x1A, 0x00, 0x03, 0x07, 0x07, 0x0F, 0x0F, 0x0F, 0x1F, 0x38, 0x3C, 0x3E, 0x1F, 0x1F, 0x0F, 0x03, 0x01, 0x3F, 0x3F, 0x3F, 0x3F, 0x19, 0x0E, 0x1F, 0x0F, 0x01, 0x17, 0x2F, 0x35, 0x18, 0x1E, 0x0A, 0x1A, 0x00, 0x03, 0x07, 0x07, 0x0F, 0x0F, 0x0F, 0x1F, 0x38, 0x1C, 0x1E, 0x3F, 0x1F, 0x0F, 0x0F, 0x03, 0x3F, 0x7F, 0x7F, 0x3F, 0x1B, 0x0C, 0x0F, 0x0F, 0x80, 0xC0, 0xE0, 0xE0, 0xF0, 0xF0, 0xF8, 0xFC, 0x00, 0x40, 0x60, 0xA0, 0xB0, 0xB0, 0xD8, 0xDC, 0xFE, 0xFE, 0xFE, 0xFC, 0xF8, 0xF0, 0xC0, 0x80, 0x0E, 0xFE, 0xFE, 0xFC, 0x18, 0xE0, 0xF0, 0x80, 0x80, 0xC0, 0xE0, 0xE0, 0xF0, 0xF0, 0xF8, 0xFC, 0x00, 0x40, 0x60, 0xE0, 0xF0, 0xF0, 0x78, 0x7C, 0xFC, 0xFE, 0xFE, 0xFC, 0xF8, 0xF0, 0xF0, 0x00, 0x0C, 0xFE, 0xFE, 0xFE, 0x38, 0xC0, 0xF0, 0xF0);
    vpatch(rom, 0x12400, 384, 0x01, 0x03, 0x07, 0x05, 0x08, 0x0E, 0x0A, 0x1A, 0x00, 0x03, 0x07, 0x07, 0x0F, 0x0F, 0x0F, 0x1F, 0x38, 0x3C, 0x3E, 0x1F, 0x1F, 0x0F, 0x03, 0x01, 0x3F, 0x3F, 0x3F, 0x3F, 0x19, 0x0E, 0x1F, 0x0F, 0x80, 0xE8, 0xF4, 0xAC, 0x18, 0x78, 0x50, 0x58, 0x00, 0xC0, 0xE0, 0xE0, 0xF0, 0xF0, 0xF0, 0xF8, 0x1C, 0x38, 0x78, 0xFC, 0xF8, 0xF8, 0xF0, 0xC0, 0xFC, 0xFE, 0xFE, 0xFC, 0xD8, 0x38, 0xF0, 0xF0, 0x01, 0x17, 0x2F, 0x35, 0x18, 0x1E, 0x0A, 0x1A, 0x00, 0x03, 0x07, 0x07, 0x0F, 0x0F, 0x0F, 0x1F, 0x38, 0x1C, 0x1E, 0x3F, 0x1F, 0x0F, 0x0F, 0x03, 0x3F, 0x7F, 0x7F, 0x3F, 0x1B, 0x0C, 0x0F, 0x0F, 0x80, 0xC0, 0xE0, 0xA0, 0x10, 0x70, 0x50, 0x58, 0x00, 0xC0, 0xE0, 0xE0, 0xF0, 0xF0, 0xF0, 0xF8, 0x1C, 0x3C, 0x7C, 0xF8, 0xF8, 0xF0, 0xC0, 0x80, 0xFC, 0xFC, 0xFC, 0xFC, 0x98, 0x70, 0xF8, 0xF0, 0x01, 0x03, 0x07, 0x07, 0x0F, 0x0F, 0x1F, 0x3F, 0x00, 0x02, 0x07, 0x06, 0x0E, 0x0E, 0x1E, 0x3F, 0x3F, 0x7F, 0x7F, 0x3F, 0x1F, 0x0F, 0x0F, 0x00, 0x30, 0x7F, 0x7F, 0x7F, 0x1C, 0x03, 0x0F, 0x0F, 0x80, 0xC0, 0xE0, 0xE0, 0xF0, 0xF0, 0xF8, 0xFC, 0x00, 0x40, 0x60, 0xA0, 0xB0, 0xB0, 0xD8, 0xDC, 0xFE, 0xFE, 0xFE, 0xFC, 0xF8, 0xF0, 0xC0, 0x80, 0x0E, 0xFE, 0xFE, 0xFC, 0x18, 0xE0, 0xF0, 0x80, 0x01, 0x03, 0x07, 0x07, 0x0F, 0x0F, 0x1F, 0x3F, 0x00, 0x02, 0x05, 0x02, 0x0A, 0x0A, 0x1B, 0x3F, 0x7F, 0x7F, 0x7F, 0x3F, 0x1F, 0x0F, 0x03, 0x01, 0x70, 0x7F, 0x7F, 0x3F, 0x18, 0x07, 0x0F, 0x01, 0x80, 0xC0, 0xE0, 0xE0, 0xF0, 0xF0, 0xF8, 0xFC, 0x00, 0x40, 0x60, 0xE0, 0xF0, 0xF0, 0x78, 0x7C, 0xFC, 0xFE, 0xFE, 0xFC, 0xF8, 0xF0, 0xF0, 0x00, 0x0C, 0xFE, 0xFE, 0xFE, 0x38, 0xC0, 0xF0, 0xF0, 0x01, 0x1F, 0x6F, 0x17, 0x17, 0x27, 0x27, 0x07, 0x00, 0x01, 0x03, 0x07, 0x07, 0x07, 0x07, 0x07, 0x07, 0x0F, 0x0F, 0x0F, 0x07, 0x07, 0x07, 0x00, 0x00, 0x07, 0x07, 0x07, 0x07, 0x00, 0x07, 0x01, 0x80, 0xF0, 0xF8, 0xE8, 0xC0, 0xF0, 0x50, 0x50, 0x00, 0xF0, 0xF8, 0xF8, 0xF8, 0xF8, 0xF8, 0xF8, 0xC0, 0xC0, 0xE0, 0xC8, 0xC8, 0xF8, 0xF0, 0x00, 0x78, 0x78, 0xB0, 0xF8, 0xF0, 0x38, 0xC0, 0xE0, 0x01, 0x1F, 0x27, 0x4F, 0x17, 0x17, 0x0F, 0x07, 0x00, 0x01, 0x03, 0x07, 0x07, 0x07, 0x07, 0x07, 0x07, 0x0F, 0x0F, 0x1F, 0x1F, 0x03, 0x03, 0x00, 0x00, 0x07, 0x0F, 0x1F, 0x1F, 0x18, 0x07, 0x06, 0x80, 0xF0, 0xF8, 0xE8, 0xC0, 0xF0, 0x50, 0x50, 0x00, 0xF0, 0xF8, 0xF8, 0xF8, 0xF8, 0xF8, 0xF8, 0xC0, 0xC0, 0xEC, 0xFC, 0xFC, 0xF8, 0xF0, 0x00, 0x78, 0x78, 0xBE, 0xDE, 0xE4, 0x38, 0xC0, 0x38);
    vpatch(rom, 0x12a20, 112, 0x3F, 0x7F, 0x7F, 0x3F, 0x1F, 0x0F, 0x0F, 0x00, 0x30, 0x7F, 0x7F, 0x7F, 0x7C, 0x33, 0x0F, 0x0F, 0xFF, 0xFF, 0xFE, 0xFC, 0xF8, 0xF0, 0xC0, 0x80, 0x0F, 0xFF, 0xFE, 0xFC, 0x18, 0xE0, 0xF0, 0x80, 0x01, 0x03, 0x07, 0x07, 0x0F, 0x0F, 0x1F, 0x3F, 0x00, 0x02, 0x07, 0x06, 0x0E, 0x0E, 0x1E, 0x3F, 0x80, 0xC6, 0xEF, 0xE3, 0xF3, 0xF9, 0xFF, 0xFF, 0x00, 0x46, 0x6F, 0xAF, 0xBF, 0xB7, 0xD9, 0xDD, 0x7F, 0x7F, 0x7F, 0x1F, 0x0F, 0x0F, 0x03, 0x01, 0x70, 0x7F, 0x7F, 0x7F, 0x38, 0x07, 0x0F, 0x01, 0xFF, 0xFF, 0xFE, 0xFC, 0xF8, 0xF0, 0xF0, 0x00, 0x0D, 0xFF, 0xFE, 0xFE, 0x38, 0xC0, 0xF0, 0xF0, 0x01, 0x03, 0x07, 0x07, 0x0F, 0x0F, 0x1F, 0x3F, 0x00, 0x02, 0x05, 0x02, 0x0A, 0x0A, 0x1B, 0x3F);
    vpatch(rom, 0x12aa0,  16, 0xF8, 0xF8, 0xFD, 0xFF, 0xFF, 0x7F, 0x7E, 0x00, 0x0F, 0xEF, 0xF7, 0xFB, 0xFC, 0x07, 0xF8, 0xC7);
    vpatch(rom, 0x12ac0,  16, 0x80, 0xC6, 0xEF, 0xE3, 0xF3, 0xF9, 0xFF, 0xFF, 0x00, 0x46, 0x6F, 0xEF, 0xFF, 0xF7, 0x79, 0x7D);
    vpatch(rom, 0x12ae0,  16, 0xF8, 0xF8, 0xFD, 0xFE, 0xFE, 0x7F, 0x7E, 0x00, 0x0F, 0xEF, 0xF7, 0xFB, 0xFF, 0x07, 0x78, 0x3C);
    vpatch(rom, 0x12b50,  16, 0x30, 0xF8, 0xFC, 0xB4, 0x02, 0xCE, 0x4A, 0x4B, 0x00, 0x78, 0xFC, 0xFC, 0xFE, 0xFE, 0xFE, 0xFF);
    vpatch(rom, 0x12b80,  32, 0x30, 0x7D, 0xFE, 0xB4, 0x02, 0xCE, 0x4A, 0x4B, 0x00, 0x78, 0xFC, 0xFC, 0xFE, 0xFE, 0xFE, 0xFF, 0x30, 0xFE, 0xFF, 0xFD, 0xF8, 0xFE, 0xEA, 0xEA, 0x00, 0x3E, 0x7F, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF);
    vpatch(rom, 0x12bd0,  16, 0xB0, 0x7E, 0xFF, 0xFD, 0xF8, 0xFE, 0xEA, 0xEA, 0x00, 0x3E, 0x7F, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF);
}